

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::FixupOutPolyline(Clipper *this,OutRec *outrec)

{
  OutPt *pOVar1;
  OutPt *pOVar2;
  OutPt *pOVar3;
  OutPt *pOVar4;
  OutPt *local_20;
  
  local_20 = outrec->Pts;
  pOVar4 = local_20->Prev;
  pOVar3 = local_20;
  while (pOVar3 != pOVar4) {
    pOVar1 = pOVar3->Next;
    pOVar2 = pOVar1->Prev;
    pOVar3 = pOVar1;
    if (((pOVar1->Pt).X == (pOVar2->Pt).X) && ((pOVar1->Pt).Y == (pOVar2->Pt).Y)) {
      if (pOVar1 == pOVar4) {
        pOVar4 = pOVar2;
      }
      pOVar2->Next = pOVar1->Next;
      pOVar1->Next->Prev = pOVar2;
      pOVar3 = pOVar2;
      if (pOVar1 != (OutPt *)0x0) {
        operator_delete(pOVar1,0x28);
      }
    }
  }
  if (pOVar3 == pOVar3->Prev) {
    local_20 = pOVar3;
    DisposeOutPts(&local_20);
    outrec->Pts = (OutPt *)0x0;
  }
  return;
}

Assistant:

void Clipper::FixupOutPolyline(OutRec &outrec)
{
  OutPt *pp = outrec.Pts;
  OutPt *lastPP = pp->Prev;
  while (pp != lastPP)
  {
    pp = pp->Next;
    if (pp->Pt == pp->Prev->Pt)
    {
      if (pp == lastPP) lastPP = pp->Prev;
      OutPt *tmpPP = pp->Prev;
      tmpPP->Next = pp->Next;
      pp->Next->Prev = tmpPP;
      delete pp;
      pp = tmpPP;
    }
  }

  if (pp == pp->Prev)
  {
    DisposeOutPts(pp);
    outrec.Pts = 0;
    return;
  }
}